

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arcflow.cpp
# Opt level: O1

void __thiscall Arcflow::reduce_redundancy(Arcflow *this)

{
  __normal_iterator<Arc_*,_std::vector<Arc,_std::allocator<Arc>_>_> __first;
  __normal_iterator<Arc_*,_std::vector<Arc,_std::allocator<Arc>_>_> __last;
  int iVar1;
  pointer pAVar2;
  runtime_error *this_00;
  ulong uVar3;
  pointer pAVar4;
  int *__args;
  pointer pAVar5;
  pointer pAVar6;
  __normal_iterator<Arc_*,_std::vector<Arc,_std::allocator<Arc>_>_> __i;
  long lVar7;
  __normal_iterator<Arc_*,_std::vector<Arc,_std::allocator<Arc>_>_> __last_00;
  long lVar8;
  vector<int,_std::allocator<int>_> types;
  int local_12c;
  vector<int,_std::allocator<int>_> local_128 [11];
  
  if (this->ready != false) {
    snprintf((char *)local_128,0x100,"AssertionError: assertion `%s` failed in \"%s\" line %d",
             "ready == false",
             "/workspace/llm4binary/github/license_c_cmakelists/fdabrandao[P]vpsolver/src/arcflow.cpp"
             ,0x1a5);
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,(char *)local_128);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_128[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_128[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (int *)0x0;
  local_128[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  if (0 < (this->inst).nsizes) {
    lVar8 = 0x34;
    lVar7 = 0;
    do {
      __args = (int *)((long)&(((this->sitems).super__Vector_base<Item,_std::allocator<Item>_>.
                                _M_impl.super__Vector_impl_data._M_start)->w).
                              super__Vector_base<int,_std::allocator<int>_>._M_impl + lVar8);
      if (local_128[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
          ._M_finish ==
          local_128[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
          ._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)local_128,
                   (iterator)
                   local_128[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,__args);
      }
      else {
        *local_128[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = *__args;
        local_128[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_128[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      lVar7 = lVar7 + 1;
      lVar8 = lVar8 + 0x48;
    } while (lVar7 < (this->inst).nsizes);
  }
  local_12c = -1;
  if (local_128[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_128[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
              (local_128,
               (iterator)
               local_128[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,&local_12c);
  }
  else {
    *local_128[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
     _M_finish = -1;
    local_128[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_128[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  __first._M_current =
       (this->A).super__Vector_base<Arc,_std::allocator<Arc>_>._M_impl.super__Vector_impl_data.
       _M_start;
  __last._M_current =
       (this->A).super__Vector_base<Arc,_std::allocator<Arc>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  if (__first._M_current != __last._M_current) {
    uVar3 = ((long)__last._M_current - (long)__first._M_current >> 2) * -0x5555555555555555;
    lVar7 = 0x3f;
    if (uVar3 != 0) {
      for (; uVar3 >> lVar7 == 0; lVar7 = lVar7 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<Arc*,std::vector<Arc,std::allocator<Arc>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<Arcflow::reduce_redundancy()::__0>>
              (__first,__last,(ulong)(((uint)lVar7 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_fdabrandao[P]vpsolver_src_arcflow_cpp:428:19)>
                )local_128);
    if ((long)__last._M_current - (long)__first._M_current < 0xc1) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<Arc*,std::vector<Arc,std::allocator<Arc>>>,__gnu_cxx::__ops::_Iter_comp_iter<Arcflow::reduce_redundancy()::__0>>
                (__first,__last,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_fdabrandao[P]vpsolver_src_arcflow_cpp:428:19)>
                  )local_128);
    }
    else {
      __last_00._M_current = __first._M_current + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<Arc*,std::vector<Arc,std::allocator<Arc>>>,__gnu_cxx::__ops::_Iter_comp_iter<Arcflow::reduce_redundancy()::__0>>
                (__first,__last_00,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_fdabrandao[P]vpsolver_src_arcflow_cpp:428:19)>
                  )local_128);
      if (__last_00._M_current != __last._M_current) {
        do {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<Arc*,std::vector<Arc,std::allocator<Arc>>>,__gnu_cxx::__ops::_Val_comp_iter<Arcflow::reduce_redundancy()::__0>>
                    (__last_00,
                     (_Val_comp_iter<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_fdabrandao[P]vpsolver_src_arcflow_cpp:428:19)>
                      )local_128);
          __last_00._M_current = __last_00._M_current + 1;
        } while (__last_00._M_current != __last._M_current);
      }
    }
  }
  pAVar6 = (this->A).super__Vector_base<Arc,_std::allocator<Arc>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pAVar2 = (this->A).super__Vector_base<Arc,_std::allocator<Arc>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  pAVar5 = pAVar6 + 1;
  pAVar4 = pAVar2;
  if (pAVar5 != pAVar2 && pAVar6 != pAVar2) {
    do {
      if (((pAVar5[-1].u == pAVar5->u) && (pAVar5[-1].v == pAVar5->v)) &&
         (local_128[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
          ._M_start[pAVar5[-1].label] ==
          local_128[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
          ._M_start[pAVar5->label])) {
        pAVar4 = pAVar5 + -1;
        break;
      }
      pAVar5 = pAVar5 + 1;
    } while (pAVar5 != pAVar2);
  }
  if (pAVar4 != pAVar2) {
    for (pAVar6 = pAVar4 + 2; pAVar6 != pAVar2; pAVar6 = pAVar6 + 1) {
      if (((pAVar4->u != pAVar6->u) || (pAVar4->v != pAVar6->v)) ||
         (local_128[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
          ._M_start[pAVar4->label] !=
          local_128[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
          ._M_start[pAVar6->label])) {
        pAVar4[1].label = pAVar6->label;
        iVar1 = pAVar6->v;
        pAVar4[1].u = pAVar6->u;
        pAVar4[1].v = iVar1;
        pAVar4 = pAVar4 + 1;
      }
    }
    pAVar2 = pAVar4 + 1;
  }
  pAVar6 = (this->A).super__Vector_base<Arc,_std::allocator<Arc>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  if ((pAVar2 != pAVar6) &&
     (pAVar4 = (this->A).super__Vector_base<Arc,_std::allocator<Arc>_>._M_impl.
               super__Vector_impl_data._M_finish,
     pAVar2 = (pointer)((long)pAVar2 + ((long)pAVar4 - (long)pAVar6)), pAVar4 != pAVar2)) {
    (this->A).super__Vector_base<Arc,_std::allocator<Arc>_>._M_impl.super__Vector_impl_data.
    _M_finish = pAVar2;
  }
  if (local_128[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_128[0].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Arcflow::reduce_redundancy() {
	throw_assert(ready == false);
	// remove redundant parallel arcs
	std::vector<int> types;
	for (int i = 0; i < inst.nsizes; i++) {
		types.push_back(sitems[i].type);
	}
	types.push_back(-1);
	auto comp_less = [&types](const Arc &a, const Arc &b) {
		return (a.u < b.u) ||
			   (a.u == b.u && a.v < b.v) ||
			   (a.u == b.u && a.v == b.v && types[a.label] < types[b.label]);
	};
	auto comp_equal = [&types](const Arc &a, const Arc &b) {
		return a.u == b.u && a.v == b.v && types[a.label] == types[b.label];
	};
	sort(all(A), comp_less);
	A.erase(unique(all(A), comp_equal), A.end());
}